

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  u32 amt;
  long lVar1;
  MemPage *pPage;
  int iVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uchar *pBuf;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  byte *pKey1;
  int iVar9;
  i64 nCellKey;
  u32 dummy;
  u64 local_40;
  u32 local_34;
  
  if (((pCur->eState == '\x01') && (pCur->validNKey != '\0')) && (pCur->apPage[0]->intKey != '\0'))
  {
    lVar1 = (pCur->info).nKey;
    if (lVar1 == intKey) {
      *pRes = 0;
      return 0;
    }
    if ((lVar1 < intKey) && (pCur->atLast != '\0')) {
      *pRes = -1;
      return 0;
    }
  }
  iVar4 = moveToRoot(pCur);
  if (iVar4 != 0) {
    return iVar4;
  }
  if (pCur->eState == '\0') {
    *pRes = -1;
    return 0;
  }
LAB_0013f195:
  pPage = pCur->apPage[pCur->iPage];
  iVar6 = pPage->nCell - 1;
  iVar4 = (int)(((uint)pPage->nCell - (iVar6 >> 0x1f)) + -1) >> 1;
  if (biasRight != 0) {
    iVar4 = iVar6;
  }
  pCur->aiIdx[pCur->iPage] = (u16)iVar4;
  iVar2 = 0;
  do {
    iVar9 = iVar4;
    (pCur->info).nSize = 0;
    pbVar8 = pPage->aData +
             (CONCAT11(pPage->aCellIdx[(long)iVar9 * 2],pPage->aCellIdx[(long)iVar9 * 2 + 1]) &
             pPage->maskPage) + pPage->childPtrSize;
    if (pPage->intKey == '\0') {
      bVar3 = *pbVar8;
      uVar7 = (uint)bVar3;
      pKey1 = pbVar8 + 1;
      if (pPage->max1bytePayload < bVar3) {
        if ((-1 < (char)*pKey1) &&
           (uVar7 = (bVar3 & 0x7f) << 7 | (int)(char)*pKey1, uVar7 <= pPage->maxLocal)) {
          pKey1 = pbVar8 + 2;
          goto LAB_0013f304;
        }
        btreeParseCellPtr(pPage,pPage->aData +
                                (CONCAT11(pPage->aCellIdx[(long)iVar9 * 2],
                                          pPage->aCellIdx[(long)iVar9 * 2 + 1]) & pPage->maskPage),
                          &pCur->info);
        amt = (u32)(pCur->info).nKey;
        pBuf = (uchar *)sqlite3Malloc(amt);
        if (pBuf == (uchar *)0x0) {
          return 7;
        }
        iVar4 = accessPayload(pCur,0,amt,pBuf,0);
        if (iVar4 != 0) {
          sqlite3_free(pBuf);
          return iVar4;
        }
        iVar4 = sqlite3VdbeRecordCompare(amt,pBuf,pIdxKey);
        sqlite3_free(pBuf);
      }
      else {
LAB_0013f304:
        iVar4 = sqlite3VdbeRecordCompare(uVar7,pKey1,pIdxKey);
      }
      if (iVar4 == 0) {
        if (pPage->intKey == '\0') goto LAB_0013f439;
        goto LAB_0013f377;
      }
    }
    else {
      if (pPage->hasData != '\0') {
        uVar5 = 1;
        if ((char)*pbVar8 < '\0') {
          bVar3 = sqlite3GetVarint32(pbVar8,&local_34);
          uVar5 = (ulong)bVar3;
        }
        pbVar8 = pbVar8 + uVar5;
      }
      sqlite3GetVarint(pbVar8,&local_40);
      pCur->validNKey = '\x01';
      (pCur->info).nKey = local_40;
      if (local_40 == intKey) {
LAB_0013f377:
        iVar4 = 0;
        if (pPage->leaf != '\0') {
LAB_0013f439:
          *pRes = 0;
          return 0;
        }
        goto LAB_0013f384;
      }
      iVar4 = (uint)(intKey <= (long)local_40) * 2 + -1;
    }
    if (iVar4 < 0) {
      iVar9 = iVar9 + 1;
    }
    else {
      iVar6 = iVar9 + -1;
      iVar9 = iVar2;
    }
    if (iVar6 < iVar9) break;
    iVar4 = (iVar6 + iVar9) / 2;
    pCur->aiIdx[pCur->iPage] = (u16)iVar4;
    iVar2 = iVar9;
  } while( true );
  if (pPage->leaf == '\0') {
LAB_0013f384:
    if (iVar9 < (int)(uint)pPage->nCell) {
      lVar1 = (ulong)(CONCAT11(pPage->aCellIdx[(long)iVar9 * 2],pPage->aCellIdx[(long)iVar9 * 2 + 1]
                              ) & pPage->maskPage) + 3;
    }
    else {
      lVar1 = (ulong)pPage->hdrOffset + 0xb;
    }
    pbVar8 = pPage->aData + lVar1;
    uVar7 = (uint)*pbVar8 |
            (uint)pbVar8[-1] << 8 | (uint)pbVar8[-2] << 0x10 | (uint)pbVar8[-3] << 0x18;
    if (uVar7 != 0) {
      pCur->aiIdx[pCur->iPage] = (u16)iVar9;
      (pCur->info).nSize = 0;
      pCur->validNKey = '\0';
      iVar4 = moveToChild(pCur,uVar7);
      if (iVar4 != 0) {
        return iVar4;
      }
      goto LAB_0013f195;
    }
  }
  *pRes = iVar4;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;

  assert( cursorHoldsMutex(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pCur->eState==CURSOR_VALID && pCur->validNKey 
   && pCur->apPage[0]->intKey 
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->atLast && pCur->info.nKey<intKey ){
      *pRes = -1;
      return SQLITE_OK;
    }
  }

  rc = moveToRoot(pCur);
  if( rc ){
    return rc;
  }
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage] );
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->isInit );
  assert( pCur->eState==CURSOR_INVALID || pCur->apPage[pCur->iPage]->nCell>0 );
  if( pCur->eState==CURSOR_INVALID ){
    *pRes = -1;
    assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->nCell==0 );
    return SQLITE_OK;
  }
  assert( pCur->apPage[0]->intKey || pIdxKey );
  for(;;){
    int lwr, upr, idx;
    Pgno chldPg;
    MemPage *pPage = pCur->apPage[pCur->iPage];
    int c;

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    if( biasRight ){
      pCur->aiIdx[pCur->iPage] = (u16)(idx = upr);
    }else{
      pCur->aiIdx[pCur->iPage] = (u16)(idx = (upr+lwr)/2);
    }
    for(;;){
      u8 *pCell;                          /* Pointer to current cell in pPage */

      assert( idx==pCur->aiIdx[pCur->iPage] );
      pCur->info.nSize = 0;
      pCell = findCell(pPage, idx) + pPage->childPtrSize;
      if( pPage->intKey ){
        i64 nCellKey;
        if( pPage->hasData ){
          u32 dummy;
          pCell += getVarint32(pCell, dummy);
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey==intKey ){
          c = 0;
        }else if( nCellKey<intKey ){
          c = -1;
        }else{
          assert( nCellKey>intKey );
          c = +1;
        }
        pCur->validNKey = 1;
        pCur->info.nKey = nCellKey;
      }else{
        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        int nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload
         /* && (pCell+nCell)<pPage->aDataEnd */
        ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = sqlite3VdbeRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
          /* && (pCell+nCell+2)<=pPage->aDataEnd */
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = sqlite3VdbeRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          btreeParseCellPtr(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          pCellKey = sqlite3Malloc( nCell );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM;
            goto moveto_finish;
          }
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
      }
      if( c==0 ){
        if( pPage->intKey && !pPage->leaf ){
          lwr = idx;
          break;
        }else{
          *pRes = 0;
          rc = SQLITE_OK;
          goto moveto_finish;
        }
      }
      if( c<0 ){
        lwr = idx+1;
      }else{
        upr = idx-1;
      }
      if( lwr>upr ){
        break;
      }
      pCur->aiIdx[pCur->iPage] = (u16)(idx = (lwr+upr)/2);
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      chldPg = 0;
    }else if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    if( chldPg==0 ){
      assert( pCur->aiIdx[pCur->iPage]<pCur->apPage[pCur->iPage]->nCell );
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
    pCur->aiIdx[pCur->iPage] = (u16)lwr;
    pCur->info.nSize = 0;
    pCur->validNKey = 0;
    rc = moveToChild(pCur, chldPg);
    if( rc ) goto moveto_finish;
  }
moveto_finish:
  return rc;
}